

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_filterbank.c
# Opt level: O0

void AllPassFilter(int16_t *data_in,size_t data_length,int16_t filter_coefficient,
                  int16_t *filter_state,int16_t *data_out)

{
  short sVar1;
  undefined4 local_44;
  int32_t state32;
  int32_t tmp32;
  int16_t tmp16;
  size_t i;
  int16_t *data_out_local;
  int16_t *filter_state_local;
  int16_t filter_coefficient_local;
  size_t data_length_local;
  int16_t *data_in_local;
  
  local_44 = (int)*filter_state << 0x10;
  i = (size_t)data_out;
  data_length_local = (size_t)data_in;
  for (_tmp32 = 0; _tmp32 < data_length; _tmp32 = _tmp32 + 1) {
    sVar1 = (short)((uint)(local_44 + (int)filter_coefficient * (int)*(short *)data_length_local) >>
                   0x10);
    *(short *)i = sVar1;
    local_44 = (*(short *)data_length_local * 0x4000 - (int)filter_coefficient * (int)sVar1) * 2;
    data_length_local = data_length_local + 4;
    i = i + 2;
  }
  *filter_state = (int16_t)((uint)local_44 >> 0x10);
  return;
}

Assistant:

static void AllPassFilter(const int16_t* data_in, size_t data_length,
                          int16_t filter_coefficient, int16_t* filter_state,
                          int16_t* data_out) {
  // The filter can only cause overflow (in the w16 output variable)
  // if more than 4 consecutive input numbers are of maximum value and
  // has the the same sign as the impulse responses first taps.
  // First 6 taps of the impulse response:
  // 0.6399 0.5905 -0.3779 0.2418 -0.1547 0.0990

  size_t i;
  int16_t tmp16 = 0;
  int32_t tmp32 = 0;
  int32_t state32 = ((int32_t) (*filter_state) * (1 << 16));  // Q15

  for (i = 0; i < data_length; i++) {
    tmp32 = state32 + filter_coefficient * *data_in;
    tmp16 = (int16_t) (tmp32 >> 16);  // Q(-1)
    *data_out++ = tmp16;
    state32 = (*data_in * (1 << 14)) - filter_coefficient * tmp16;  // Q14
    state32 *= 2;  // Q15.
    data_in += 2;
  }

  *filter_state = (int16_t) (state32 >> 16);  // Q(-1)
}